

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_1412e7::fillPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int width,int height)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  float *pfVar4;
  float **ppfVar5;
  int in_ECX;
  int in_EDX;
  Array2D<float_*> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  uint i;
  int x;
  int y;
  uint local_24;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar7;
  
  Imf_2_5::Array2D<float_*>::resizeErase
            (in_RSI,CONCAT44(in_EDX,in_ECX),
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar7 = 0; iVar7 < in_ECX; iVar7 = iVar7 + 1) {
    for (iVar6 = 0; iVar6 < in_EDX; iVar6 = iVar6 + 1) {
      puVar2 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)iVar7);
      uVar3 = SUB168(ZEXT416(puVar2[iVar6]) * ZEXT816(4),0);
      if (SUB168(ZEXT416(puVar2[iVar6]) * ZEXT816(4),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pfVar4 = (float *)operator_new__(uVar3);
      ppfVar5 = Imf_2_5::Array2D<float_*>::operator[](in_RSI,(long)iVar7);
      ppfVar5[iVar6] = pfVar4;
      local_24 = 0;
      while( true ) {
        puVar2 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)iVar7);
        if (puVar2[iVar6] <= local_24) break;
        iVar1 = iVar7 * in_EDX + iVar6;
        ppfVar5 = Imf_2_5::Array2D<float_*>::operator[](in_RSI,(long)iVar7);
        ppfVar5[iVar6][local_24] = (float)(iVar1 % 0x801);
        local_24 = local_24 + 1;
      }
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}